

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

MPP_RET mpp_create(MppCtx *ctx,MppApi **mpi)

{
  void *__s;
  Mpp *this;
  MpiImpl *p;
  MPP_RET ret;
  MppApi **mpi_local;
  MppCtx *ctx_local;
  
  mpp_env_get_u32("mpi_debug",&mpi_debug,0);
  mpp_get_log_level();
  if ((ctx == (MppCtx *)0x0) || (mpi == (MppApi **)0x0)) {
    _mpp_log_l(2,"mpi","invalid input ctx %p mpi %p\n","mpp_create",ctx,mpi);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (MppCtx)0x0;
    *mpi = (MppApi *)0x0;
    p._4_4_ = MPP_OK;
    if ((mpi_debug & 1) != 0) {
      _mpp_log_l(4,"mpi","enter ctx %p mpi %p\n","mpp_create",ctx,mpi);
    }
    __s = mpp_osal_malloc("mpp_create",0x20);
    if (__s == (void *)0x0) {
      _mpp_log_l(2,"mpi","failed to allocate context\n","mpp_create");
      p._4_4_ = MPP_ERR_MALLOC;
    }
    else {
      memset(__s,0,0x20);
      this = (Mpp *)operator_new(0x1a8);
      Mpp::Mpp(this,__s);
      *(Mpp **)((long)__s + 0x18) = this;
      if (*(long *)((long)__s + 0x18) == 0) {
        mpp_osal_free("mpp_create",__s);
        _mpp_log_l(2,"mpi","failed to new Mpp\n","mpp_create");
        p._4_4_ = MPP_ERR_MALLOC;
      }
      else {
        mpp_api.version = 0;
        *(MppApi **)((long)__s + 0x10) = &mpp_api;
        *(void **)__s = __s;
        *ctx = __s;
        *mpi = *(MppApi **)((long)__s + 0x10);
      }
    }
    show_mpp_version();
    if ((mpi_debug & 1) != 0) {
      _mpp_log_l(4,"mpi","leave ret %d ctx %p mpi %p\n","mpp_create",(ulong)(uint)p._4_4_,*ctx,*mpi)
      ;
    }
    ctx_local._4_4_ = p._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_create(MppCtx *ctx, MppApi **mpi)
{
    mpp_env_get_u32("mpi_debug", &mpi_debug, 0);
    mpp_get_log_level();

    if (NULL == ctx || NULL == mpi) {
        mpp_err_f("invalid input ctx %p mpi %p\n", ctx, mpi);
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;
    *mpi = NULL;

    MPP_RET ret = MPP_OK;
    mpi_dbg_func("enter ctx %p mpi %p\n", ctx, mpi);
    do {
        MpiImpl *p = mpp_malloc(MpiImpl, 1);
        if (NULL == p) {
            mpp_err_f("failed to allocate context\n");
            ret = MPP_ERR_MALLOC;
            break;
        }

        memset(p, 0, sizeof(*p));
        p->ctx = new Mpp(p);
        if (NULL == p->ctx) {
            mpp_free(p);
            mpp_err_f("failed to new Mpp\n");
            ret = MPP_ERR_MALLOC;
            break;
        }

        mpp_api.version = 0;
        p->api      = &mpp_api;
        p->check    = p;
        *ctx = p;
        *mpi = p->api;
    } while (0);

    show_mpp_version();

    mpi_dbg_func("leave ret %d ctx %p mpi %p\n", ret, *ctx, *mpi);
    return ret;
}